

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

int getPixelInterpolated(gdImagePtr im,double x,double y,int bgColor)

{
  int x_00;
  int y_00;
  uint uVar1;
  double dVar2;
  double dVar3;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  int rgbs_1;
  int rgbs;
  int xii;
  double new_a;
  double new_b;
  double new_g;
  double new_r;
  double kernel_y [4];
  double kernel_x [12];
  double kernel_cache_y;
  double kernel;
  int local_38;
  int i;
  int yii;
  int yi;
  int xi;
  int bgColor_local;
  double y_local;
  double x_local;
  gdImagePtr im_local;
  
  x_00 = (int)x;
  y_00 = (int)y;
  new_g = 0.0;
  new_b = 0.0;
  new_a = 0.0;
  _rgbs = 0.0;
  if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
    im_local._4_4_ = -1;
  }
  else if (im->interpolation_id == GD_WEIGHTED4) {
    im_local._4_4_ = getPixelInterpolateWeight(im,x,y,bgColor);
  }
  else if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
    if (im->trueColor == 1) {
      im_local._4_4_ = getPixelOverflowTC(im,x_00,y_00,bgColor);
    }
    else {
      im_local._4_4_ = getPixelOverflowPalette(im,x_00,y_00,bgColor);
    }
  }
  else if (im->interpolation == (interpolation_method)0x0) {
    im_local._4_4_ = -1;
  }
  else {
    for (kernel._4_4_ = 0; kernel._4_4_ < 4; kernel._4_4_ = kernel._4_4_ + 1) {
      dVar2 = (*im->interpolation)((double)(x_00 + kernel._4_4_ + -1) - x);
      kernel_y[(long)kernel._4_4_ + 3] = dVar2;
      dVar2 = (*im->interpolation)((double)(y_00 + kernel._4_4_ + -1) - y);
      kernel_y[(long)kernel._4_4_ + -1] = dVar2;
    }
    for (local_38 = y_00 + -1; local_38 < y_00 + 3; local_38 = local_38 + 1) {
      dVar2 = kernel_y[(long)(local_38 - (y_00 + -1)) + -1];
      if (im->trueColor == 0) {
        for (rgbs_1 = x_00 + -1; rgbs_1 < x_00 + 3; rgbs_1 = rgbs_1 + 1) {
          uVar1 = getPixelOverflowPalette(im,rgbs_1,local_38,bgColor);
          dVar3 = dVar2 * kernel_y[(long)(rgbs_1 - (x_00 + -1)) + 3];
          new_g = dVar3 * (double)((int)(uVar1 & 0xff0000) >> 0x10) + new_g;
          new_b = dVar3 * (double)((int)(uVar1 & 0xff00) >> 8) + new_b;
          new_a = dVar3 * (double)(uVar1 & 0xff) + new_a;
          _rgbs = dVar3 * (double)((int)(uVar1 & 0x7f000000) >> 0x18) + _rgbs;
        }
      }
      else {
        for (rgbs_1 = x_00 + -1; rgbs_1 < x_00 + 3; rgbs_1 = rgbs_1 + 1) {
          uVar1 = getPixelOverflowTC(im,rgbs_1,local_38,bgColor);
          dVar3 = dVar2 * kernel_y[(long)(rgbs_1 - (x_00 + -1)) + 3];
          new_g = dVar3 * (double)((int)(uVar1 & 0xff0000) >> 0x10) + new_g;
          new_b = dVar3 * (double)((int)(uVar1 & 0xff00) >> 8) + new_b;
          new_a = dVar3 * (double)(uVar1 & 0xff) + new_a;
          _rgbs = dVar3 * (double)((int)(uVar1 & 0x7f000000) >> 0x18) + _rgbs;
        }
      }
    }
    if (new_g <= 255.0) {
      if (0.0 <= new_g) {
        local_118 = new_g;
      }
      else {
        local_118 = 0.0;
      }
      local_110 = local_118;
    }
    else {
      local_110 = 255.0;
    }
    if (new_b <= 255.0) {
      if (0.0 <= new_b) {
        local_128 = new_b;
      }
      else {
        local_128 = 0.0;
      }
      local_120 = local_128;
    }
    else {
      local_120 = 255.0;
    }
    if (new_a <= 255.0) {
      if (0.0 <= new_a) {
        local_138 = new_a;
      }
      else {
        local_138 = 0.0;
      }
      local_130 = local_138;
    }
    else {
      local_130 = 255.0;
    }
    if (_rgbs <= 127.0) {
      if (0.0 <= _rgbs) {
        local_148 = _rgbs;
      }
      else {
        local_148 = 0.0;
      }
      local_140 = local_148;
    }
    else {
      local_140 = 127.0;
    }
    im_local._4_4_ =
         (int)local_140 * 0x1000000 + (int)local_110 * 0x10000 + (int)local_120 * 0x100 +
         (int)local_130;
  }
  return im_local._4_4_;
}

Assistant:

int getPixelInterpolated(gdImagePtr im, const double x, const double y, const int bgColor)
{
	const int xi=(int)(x);
	const int yi=(int)(y);
	int yii;
	int i;
	double kernel, kernel_cache_y;
	double kernel_x[12], kernel_y[4];
	double new_r = 0.0f, new_g = 0.0f, new_b = 0.0f, new_a = 0.0f;

	/* These methods use special implementations */
	if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		return -1;
	}

	if (im->interpolation_id == GD_WEIGHTED4) {
		return getPixelInterpolateWeight(im, x, y, bgColor);
	}

	if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		if (im->trueColor == 1) {
			return getPixelOverflowTC(im, xi, yi, bgColor);
		} else {
			return getPixelOverflowPalette(im, xi, yi, bgColor);
		}
	}
	if (im->interpolation) {
		for (i=0; i<4; i++) {
			kernel_x[i] = (double) im->interpolation((double)(xi+i-1-x));
			kernel_y[i] = (double) im->interpolation((double)(yi+i-1-y));
		}
	} else {
		return -1;
	}

	/*
	 * TODO: use the known fast rgba multiplication implementation once
	 * the new formats are in place
	 */
	for (yii = yi-1; yii < yi+3; yii++) {
		int xii;
		kernel_cache_y = kernel_y[yii-(yi-1)];
		if (im->trueColor) {
			for (xii=xi-1; xii<xi+3; xii++) {
				const int rgbs = getPixelOverflowTC(im, xii, yii, bgColor);

				kernel = kernel_cache_y * kernel_x[xii-(xi-1)];
				new_r += kernel * gdTrueColorGetRed(rgbs);
				new_g += kernel * gdTrueColorGetGreen(rgbs);
				new_b += kernel * gdTrueColorGetBlue(rgbs);
				new_a += kernel * gdTrueColorGetAlpha(rgbs);
			}
		} else {
			for (xii=xi-1; xii<xi+3; xii++) {
				const int rgbs = getPixelOverflowPalette(im, xii, yii, bgColor);

				kernel = kernel_cache_y * kernel_x[xii-(xi-1)];
				new_r += kernel * gdTrueColorGetRed(rgbs);
				new_g += kernel * gdTrueColorGetGreen(rgbs);
				new_b += kernel * gdTrueColorGetBlue(rgbs);
				new_a += kernel * gdTrueColorGetAlpha(rgbs);
			}
		}
	}

	new_r = CLAMP(new_r, 0, 255);
	new_g = CLAMP(new_g, 0, 255);
	new_b = CLAMP(new_b, 0, 255);
	new_a = CLAMP(new_a, 0, gdAlphaMax);

	return gdTrueColorAlpha(((int)new_r), ((int)new_g), ((int)new_b), ((int)new_a));
}